

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaStr.c
# Opt level: O1

void Str_MuxCreate(Str_Mux_t *pTree,Str_Ntk_t *pNtk,int iMux,int nMuxes,Vec_Int_t *vDelay,
                  int nLutSize)

{
  int iVar1;
  int iVar2;
  Str_Obj_t *pSVar3;
  int *piVar4;
  uint uVar5;
  Str_Edg_t *pSVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  
  if (nMuxes < 2) {
    __assert_fail("nMuxes >= 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaStr.c"
                  ,0x5da,"void Str_MuxCreate(Str_Mux_t *, Str_Ntk_t *, int, int, Vec_Int_t *, int)")
    ;
  }
  iVar7 = 0;
  memset(pTree,0,((ulong)(uint)nMuxes + 1) * 0x40);
  pTree->nLutSize = nLutSize;
  pTree->Edge[0].Fan = 1;
  iVar8 = nMuxes + iMux;
  iVar1 = pNtk->nObjs;
  pSVar6 = pTree[1].Edge;
  lVar9 = 1;
  while( true ) {
    pTree[lVar9].Id = (int)lVar9;
    pTree[lVar9].nLutSize = nLutSize;
    pTree[lVar9].Delay = -1;
    pTree[lVar9].Copy = -1;
    if (iVar1 < iVar8) break;
    pSVar3 = pNtk->pObjs;
    if (((undefined1  [16])pSVar3[iVar8 - lVar9] & (undefined1  [16])0xf) != (undefined1  [16])0x5)
    {
      __assert_fail("pObj->Type == STR_MUX",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaStr.c"
                    ,0x5e6,
                    "void Str_MuxCreate(Str_Mux_t *, Str_Ntk_t *, int, int, Vec_Int_t *, int)");
    }
    iVar2 = pSVar3[iVar8 - lVar9].iOffset;
    lVar10 = (long)iVar2;
    lVar11 = 0;
    do {
      if ((iVar2 < 0) || ((pNtk->vFanins).nSize <= lVar10)) {
LAB_007260f3:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      piVar4 = (pNtk->vFanins).pArray;
      if (piVar4[lVar10] < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                      ,0x10d,"int Abc_LitIsCompl(int)");
      }
      *(uint *)((long)&pSVar6->fCompl + lVar11) = piVar4[lVar10] & 1;
      if (piVar4[lVar10] < 0) goto LAB_00726112;
      uVar5 = (uint)piVar4[lVar10] >> 1;
      if ((int)uVar5 < iMux) {
        *(int *)((long)&pSVar6->Fan + lVar11) = -iVar7;
        if (piVar4[lVar10] < 0) {
LAB_00726112:
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                        ,0x10c,"int Abc_Lit2Var(int)");
        }
        uVar5 = (uint)piVar4[lVar10] >> 1;
        if (iVar1 <= (int)uVar5) goto LAB_00726150;
        uVar5 = pSVar3[uVar5].iCopy;
        *(uint *)((long)&pSVar6->Copy + lVar11) = uVar5;
        if ((int)uVar5 < 0) goto LAB_00726112;
        if (vDelay->nSize <= (int)(uVar5 >> 1)) goto LAB_007260f3;
        iVar7 = iVar7 + 1;
        *(int *)((long)&pSVar6->FanDel + lVar11) = vDelay->pArray[uVar5 >> 1];
      }
      else {
        *(uint *)((long)&pSVar6->Fan + lVar11) = iVar8 - uVar5;
      }
      lVar11 = lVar11 + 0x10;
      lVar10 = lVar10 + 1;
    } while (lVar11 != 0x30);
    lVar9 = lVar9 + 1;
    pSVar6 = pSVar6 + 4;
    if (lVar9 == (ulong)(uint)nMuxes + 1) {
      return;
    }
  }
LAB_00726150:
  __assert_fail("i < p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaStr.c"
                ,0x51,"Str_Obj_t *Str_NtkObj(Str_Ntk_t *, int)");
}

Assistant:

void Str_MuxCreate( Str_Mux_t * pTree, Str_Ntk_t * pNtk, int iMux, int nMuxes, Vec_Int_t * vDelay, int nLutSize )
{
    Str_Obj_t * pObj;
    Str_Mux_t * pMux;
    int i, k, nPis = 0;
    assert( nMuxes >= 2 );
    memset( pTree, 0, sizeof(Str_Mux_t) * (nMuxes + 1) );
    pTree->nLutSize = nLutSize;
    pTree->Edge[0].Fan = 1;
    for ( i = 1; i <= nMuxes; i++ )
    {
        pMux = pTree + i;
        pMux->Id = i;
        pMux->nLutSize = nLutSize;
        pMux->Delay = pMux->Copy = -1;
        // assign fanins
        pObj = Str_NtkObj( pNtk, iMux + nMuxes - i );
        assert( pObj->Type == STR_MUX );
        for ( k = 0; k < 3; k++ )
        {
            pMux->Edge[k].fCompl = Str_ObjFaninC(pNtk, pObj, k);
            if ( Str_ObjFaninId(pNtk, pObj, k) >= iMux )
                pMux->Edge[k].Fan = iMux + nMuxes - Str_ObjFaninId(pNtk, pObj, k);
            else
            {
                pMux->Edge[k].Fan = -nPis++; // count external inputs, including controls
                pMux->Edge[k].Copy = Str_ObjFanin(pNtk, pObj, k)->iCopy;
                pMux->Edge[k].FanDel = Vec_IntEntry( vDelay, Abc_Lit2Var(pMux->Edge[k].Copy) );
            }
        }
    }
}